

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_delay.h
# Opt level: O0

void __thiscall PlayerDelay::~PlayerDelay(PlayerDelay *this)

{
  void *in_RDI;
  
  ~PlayerDelay((PlayerDelay *)0x10b3e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

PlayerDelay(const std::string& name) :
      Player(name)
   {}